

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_double_to_bignum(sexp ctx,double f)

{
  double dVar1;
  sexp a;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  sexp scale;
  sexp res;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_80;
  sexp local_78;
  sexp local_70;
  undefined1 local_68 [16];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  sexp_gc_var_t local_28;
  
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = f;
  local_68._12_4_ = in_XMM0_Dd;
  local_48.var = &local_78;
  local_78 = (sexp)0x43e;
  local_28.next = &local_48;
  local_28.var = &local_80;
  local_80 = (sexp)0x43e;
  local_38.next = &local_28;
  local_38.var = &local_70;
  local_70 = (sexp)&DAT_0000043e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_28.next;
  (ctx->value).context.saves = local_38.next;
  (ctx->value).context.saves = &local_38;
  local_78 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000001);
  local_80 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000003);
  local_58 = (undefined4)(local_68._0_8_ & 0x7fffffffffffffff);
  uStack_50 = (undefined4)(local_68._8_8_ & 0x7fffffffffffffff);
  uStack_4c = (undefined4)((local_68._8_8_ & 0x7fffffffffffffff) >> 0x20);
  uStack_54 = (undefined4)((local_68._0_8_ & 0x7fffffffffffffff) >> 0x20);
  while (a = local_80, 1.0 <= (double)CONCAT44(uStack_54,local_58)) {
    dVar1 = fmod((double)CONCAT44(uStack_54,local_58),16.0);
    local_70 = sexp_bignum_fxmul(ctx,(sexp)0x0,a,
                                 (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f |
                                 (long)dVar1,0);
    local_78 = sexp_bignum_add(ctx,local_78,local_78,local_70);
    local_80 = sexp_bignum_fxmul(ctx,(sexp)0x0,local_80,0x10,0);
    dVar1 = trunc((double)CONCAT44(uStack_54,local_58) * 0.0625);
    local_58 = SUB84(dVar1,0);
    uStack_50 = extraout_XMM0_Dc;
    uStack_4c = extraout_XMM0_Dd;
    uStack_54 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  (local_78->value).flonum_bits[0] = -((double)local_68._0_8_ < 0.0) | 1;
  (ctx->value).context.saves = local_48.next;
  return local_78;
}

Assistant:

sexp sexp_double_to_bignum (sexp ctx, double f) {
  int sign;
  sexp_gc_var3(res, scale, tmp);
  sexp_gc_preserve3(ctx, res, scale, tmp);
  res = sexp_fixnum_to_bignum(ctx, SEXP_ZERO);
  scale = sexp_fixnum_to_bignum(ctx, SEXP_ONE);
  sign = (f < 0 ? -1 : 1);
  for (f=fabs(f); f >= 1.0; f=trunc(f/16)) {
    tmp = sexp_bignum_fxmul(ctx, NULL, scale, (sexp_uint_t)double_16s_digit(f), 0);
    res = sexp_bignum_add(ctx, res, res, tmp);
    scale = sexp_bignum_fxmul(ctx, NULL, scale, 16, 0);
  }
  sexp_bignum_sign(res) = sign;
  sexp_gc_release3(ctx);
  return res;
}